

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsessionparams.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSessionParams::SetNeedThreadSafety(RTPSessionParams *this,bool s)

{
  return -2;
}

Assistant:

int RTPSessionParams::SetNeedThreadSafety(bool s)
{
#ifndef RTP_SUPPORT_THREAD
	JRTPLIB_UNUSED(s);
	return ERR_RTP_NOTHREADSUPPORT;
#else
	m_needThreadSafety = s;
	return 0;
#endif // RTP_SUPPORT_THREAD
}